

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * LoadImageFromScreen(void)

{
  Vector2 VVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  Image *in_RDI;
  float local_28;
  float fStack_24;
  
  VVar1 = GetWindowScaleDPI();
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  iVar2 = GetScreenWidth();
  local_28 = VVar1.x;
  in_RDI->width = (int)((float)iVar2 * local_28);
  iVar3 = GetScreenHeight();
  fStack_24 = VVar1.y;
  in_RDI->height = (int)(fStack_24 * (float)iVar3);
  in_RDI->mipmaps = 1;
  in_RDI->format = 7;
  puVar4 = rlReadScreenPixels((int)((float)iVar2 * local_28),(int)(fStack_24 * (float)iVar3));
  in_RDI->data = puVar4;
  return in_RDI;
}

Assistant:

Image LoadImageFromScreen(void)
{
    Vector2 scale = GetWindowScaleDPI();
    Image image = { 0 };

    image.width = (int)(GetScreenWidth()*scale.x);
    image.height = (int)(GetScreenHeight()*scale.y);
    image.mipmaps = 1;
    image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
    image.data = rlReadScreenPixels(image.width, image.height);

    return image;
}